

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O0

void avro::parsing::fixup<boost::shared_ptr<avro::Node>>
               (ProductionPtr *p,
               map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
               *m)

{
  bool bVar1;
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> *in_RDI;
  iterator it;
  set<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
  seen;
  set<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
  *in_stack_00000080;
  map<boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<avro::Node>_>,_std::allocator<std::pair<const_boost::shared_ptr<avro::Node>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>_>
  *in_stack_00000088;
  Symbol *in_stack_00000090;
  vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_> *in_stack_ffffffffffffff98;
  __normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  *in_stack_ffffffffffffffa0;
  __normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  local_48 [8];
  shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_> *local_8;
  
  local_8 = in_RDI;
  std::
  set<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
  ::set((set<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
         *)0x28ca28);
  boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
  operator->(local_8);
  local_48[0]._M_current =
       (Symbol *)
       std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::begin
                 (in_stack_ffffffffffffff98);
  while( true ) {
    boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>::
    operator->(local_8);
    std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>::end
              (in_stack_ffffffffffffff98);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffa0,
                       (__normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
    ::operator*(local_48);
    fixup<boost::shared_ptr<avro::Node>>(in_stack_00000090,in_stack_00000088,in_stack_00000080);
    __gnu_cxx::
    __normal_iterator<avro::parsing::Symbol_*,_std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
    ::operator++(local_48);
  }
  std::
  set<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
  ::~set((set<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_std::less<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>,_std::allocator<boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>_>_>
          *)0x28cabb);
  return;
}

Assistant:

void fixup(const ProductionPtr& p,
           const std::map<T, ProductionPtr> &m)
{
    std::set<ProductionPtr> seen;
    for (Production::iterator it = p->begin(); it != p->end(); ++it) {
        fixup(*it, m, seen);
    }
}